

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredMMDPDiscrete.h
# Opt level: O0

void __thiscall
FactoredMMDPDiscrete::FactoredMMDPDiscrete
          (FactoredMMDPDiscrete *this,void **vtt,string *name,string *descr,string *pf)

{
  string *in_RCX;
  string *in_RDX;
  long *in_RSI;
  long *in_RDI;
  string *in_R8;
  string local_98 [8];
  string *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  void **in_stack_ffffffffffffff88;
  FactoredDecPOMDPDiscrete *in_stack_ffffffffffffff90;
  string local_68 [32];
  string local_48 [72];
  
  std::__cxx11::string::string(local_48,in_RDX);
  std::__cxx11::string::string(local_68,in_RCX);
  std::__cxx11::string::string(local_98,in_R8);
  FactoredDecPOMDPDiscrete::FactoredDecPOMDPDiscrete
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  *in_RDI = *in_RSI;
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x58)) = in_RSI[0x14];
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x60)) = in_RSI[0x15];
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x68)) = in_RSI[0x16];
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x70)) = in_RSI[0x17];
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x40)) = in_RSI[0x18];
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x50)) = in_RSI[0x19];
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x48)) = in_RSI[0x1a];
  in_RDI[0xc0] = in_RSI[0x1b];
  return;
}

Assistant:

FactoredMMDPDiscrete(
    std::string name="received unspec. by FactoredMMDPDiscrete", 
    std::string descr="received unspec. by FactoredMMDPDiscrete", 
    std::string pf="received unspec. by FactoredMMDPDiscrete")
        : FactoredDecPOMDPDiscrete(name, descr, pf)
    {
        //SetFlatObservationModel(new ObservationModelIdentityMapping());
        
        //MADPComponentDiscreteObservations::SetInitialized(true) can
        //overflow _m_nrJointObservations (indicated by _m_jointIndicesValid).
        //(likely)

        //Problem occurs if single observation variable's stepsize
        //calculations already overflow (happens in 2DBN::InitializeIIs()).
        //(unlikely)
    }